

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDivBound.cpp
# Opt level: O1

void TPZShapeHDivBound<pzshape::TPZShapePoint>::Shape
               (TPZVec<double> *pt,TPZShapeData *data,TPZFMatrix<double> *phi)

{
  if ((0 < (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow) &&
     (0 < (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
    *phi->fElem = (double)*(data->fSideOrient).super_TPZVec<int>.fStore;
    return;
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void TPZShapeHDivBound<class pzshape::TPZShapePoint>::Shape(const TPZVec<REAL> &pt, TPZShapeData &data, TPZFMatrix<REAL> &phi) {
    phi(0,0) = data.fSideOrient[0];
}